

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

uint32_t __thiscall
cfd::ConfidentialTransactionContext::UpdateFeeAmount
          (ConfidentialTransactionContext *this,Amount *value,ConfidentialAssetId *asset)

{
  uint32_t index;
  bool bVar1;
  Amount result;
  uint32_t local_b4;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  ConfidentialNonce local_80;
  ConfidentialValue local_58;
  Amount local_30;
  
  core::Amount::Amount(&local_30);
  local_b4 = 0;
  bVar1 = IsFindFeeTxOut(this,&local_b4);
  index = local_b4;
  if (bVar1) {
    core::ConfidentialValue::ConfidentialValue(&local_58,value);
    core::ConfidentialNonce::ConfidentialNonce(&local_80);
    core::ByteData::ByteData((ByteData *)&local_b0);
    core::ByteData::ByteData((ByteData *)&local_98);
    core::ConfidentialTransaction::SetTxOutCommitment
              (&this->super_ConfidentialTransaction,index,asset,&local_58,&local_80,
               (ByteData *)&local_b0,(ByteData *)&local_98);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
    core::ConfidentialNonce::~ConfidentialNonce(&local_80);
    core::ConfidentialValue::~ConfidentialValue(&local_58);
  }
  else {
    local_b4 = core::ConfidentialTransaction::AddTxOutFee
                         (&this->super_ConfidentialTransaction,value,asset);
  }
  return local_b4;
}

Assistant:

uint32_t ConfidentialTransactionContext::UpdateFeeAmount(
    const Amount& value, const ConfidentialAssetId& asset) {
  Amount result;
  uint32_t index = 0;
  if (IsFindFeeTxOut(&index)) {
    SetTxOutCommitment(
        index, asset, ConfidentialValue(value), ConfidentialNonce(),
        ByteData(), ByteData());
  } else {
    index = AddTxOutFee(value, asset);
  }
  return index;
}